

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

GLFWvidmode * glfwGetVideoModes(GLFWmonitor *handle,int *count)

{
  GLFWbool GVar1;
  _GLFWmonitor *monitor;
  int *count_local;
  GLFWmonitor *handle_local;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/susonthapa[P]3d-chair/lib/glfw/src/monitor.c"
                  ,0x179,"const GLFWvidmode *glfwGetVideoModes(GLFWmonitor *, int *)");
  }
  if (count != (int *)0x0) {
    *count = 0;
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local = (GLFWmonitor *)0x0;
    }
    else {
      GVar1 = refreshVideoModes((_GLFWmonitor *)handle);
      if (GVar1 == 0) {
        handle_local = (GLFWmonitor *)0x0;
      }
      else {
        *count = *(int *)(handle + 0x20);
        handle_local = *(GLFWmonitor **)(handle + 0x18);
      }
    }
    return (GLFWvidmode *)handle_local;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/susonthapa[P]3d-chair/lib/glfw/src/monitor.c"
                ,0x17a,"const GLFWvidmode *glfwGetVideoModes(GLFWmonitor *, int *)");
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoModes(GLFWmonitor* handle, int* count)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!refreshVideoModes(monitor))
        return NULL;

    *count = monitor->modeCount;
    return monitor->modes;
}